

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ising_model.cc
# Opt level: O1

void __thiscall lattice::print(lattice *this)

{
  int iVar1;
  undefined8 in_RAX;
  int iVar2;
  char *pcVar3;
  int iVar4;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  if (0 < this->L) {
    iVar2 = 0;
    do {
      iVar1 = this->L;
      if (0 < iVar1) {
        iVar4 = 0;
        do {
          if ((this->s).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar1 * iVar4 + iVar2] < 0) {
            uStack_38._0_7_ = CONCAT16(0x2e,(undefined6)uStack_38);
            pcVar3 = (char *)((long)&uStack_38 + 6);
          }
          else {
            uStack_38 = CONCAT17(0x23,(undefined7)uStack_38);
            pcVar3 = (char *)((long)&uStack_38 + 7);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,1);
          iVar4 = iVar4 + 1;
          iVar1 = this->L;
        } while (iVar4 < iVar1);
      }
      uStack_38._0_6_ = CONCAT15(10,(undefined5)uStack_38);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)((long)&uStack_38 + 5),1);
      iVar2 = iVar2 + 1;
    } while (iVar2 < this->L);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  return;
}

Assistant:

void lattice::print() const {
  for (int i{0}; i < L; ++i) {
    for (int j{0}; j < L; ++j)
      if (s[i + j * L] < 0)
        std::cout << '.';
      else
        std::cout << '#';
    std::cout << '\n';
  }
  std::cout << std::endl;
}